

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O2

_Bool aux_terrain(chunk *c,player *p,target_aux_state *auxst)

{
  _Bool _Var1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  mouseclick mVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  ui_event uVar9;
  char out_val [256];
  
  if ((auxst->boring == false) &&
     (_Var1 = square_isinteresting((chunk_conflict *)p->cave,auxst->grid), !_Var1)) {
    return false;
  }
  pcVar2 = square_apparent_name((chunk_conflict *)p->cave,auxst->grid);
  if (*auxst->phrase2 == '\0') {
    pcVar3 = "";
  }
  else {
    pcVar3 = square_apparent_look_in_preposition((chunk_conflict *)p->cave,auxst->grid);
  }
  pcVar4 = square_apparent_look_prefix((chunk_conflict *)p->cave,auxst->grid);
  if (p->wizard == true) {
    lVar6 = (long)(auxst->grid).y;
    lVar7 = (long)(auxst->grid).x;
    strnfmt(out_val,0x100,"%s%s%s%s, %s (%d:%d, noise=%d, scent=%d).",auxst->phrase1,pcVar3,pcVar4,
            pcVar2,auxst,lVar6,lVar7,(ulong)(c->noise).grids[lVar6][lVar7],
            (ulong)(c->scent).grids[lVar6][lVar7]);
  }
  else {
    strnfmt(out_val,0x100,"%s%s%s%s, %s.",auxst->phrase1,pcVar3,pcVar4,pcVar2,auxst);
  }
  prt(out_val,L'\0',L'\0');
  move_cursor_relative((auxst->grid).y,(auxst->grid).x);
  uVar9 = inkey_m();
  mVar5 = uVar9.mouse;
  *(mouseclick *)&auxst->press = mVar5;
  (auxst->press).key.mods = uVar9.key.mods;
  if (uVar9.type == EVT_MOUSE) {
    bVar8 = ((ulong)mVar5 & 0xff000000000000) == 0x2000000000000;
  }
  else {
    bVar8 = (ulong)mVar5 >> 0x20 != 0x20 && (ulong)mVar5 >> 0x20 != 0x9c;
  }
  return bVar8;
}

Assistant:

static bool aux_terrain(struct chunk *c, struct player *p,
		struct target_aux_state *auxst)
{
	const char *name, *lphrase2, *lphrase3;
	char out_val[TARGET_OUT_VAL_SIZE];

	if (!auxst->boring && !square_isinteresting(p->cave, auxst->grid))
		return false;

	/* Terrain feature if needed */
	name = square_apparent_name(p->cave, auxst->grid);

	/* Hack -- handle unknown grids */

	/* Pick a preposition if needed */
	lphrase2 = (*auxst->phrase2) ?
		square_apparent_look_in_preposition(p->cave, auxst->grid) : "";

	/* Pick prefix for the name */
	lphrase3 = square_apparent_look_prefix(p->cave, auxst->grid);

	/* Display a message */
	if (p->wizard) {
		strnfmt(out_val, sizeof(out_val),
			"%s%s%s%s, %s (%d:%d, noise=%d, scent=%d).",
			auxst->phrase1,
			lphrase2,
			lphrase3,
			name,
			auxst->coord_desc,
			auxst->grid.y,
			auxst->grid.x,
			(int)c->noise.grids[auxst->grid.y][auxst->grid.x],
			(int)c->scent.grids[auxst->grid.y][auxst->grid.x]);
	} else {
		strnfmt(out_val, sizeof(out_val),
			"%s%s%s%s, %s.",
			auxst->phrase1,
			lphrase2,
			lphrase3,
			name,
			auxst->coord_desc);
	}

	prt(out_val, 0, 0);
	move_cursor_relative(auxst->grid.y, auxst->grid.x);
	auxst->press = inkey_m();

	/*
	 * Stop on right click of mouse or everything but "return"/"space" for
	 * a key.
	 */
	return (auxst->press.type == EVT_MOUSE
			&& auxst->press.mouse.button == 2)
		|| (auxst->press.type != EVT_MOUSE
			&& auxst->press.key.code != KC_ENTER
			&& auxst->press.key.code != ' ');
}